

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O0

void __thiscall
DirectionCone_UnionRandoms_Test::~DirectionCone_UnionRandoms_Test
          (DirectionCone_UnionRandoms_Test *this)

{
  void *in_RDI;
  
  ~DirectionCone_UnionRandoms_Test((DirectionCone_UnionRandoms_Test *)0x687838);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(DirectionCone, UnionRandoms) {
    RNG rng(16);

    for (int i = 0; i < 100; ++i) {
        DirectionCone a = RandomCone(rng), b = RandomCone(rng);
        DirectionCone c = Union(a, b);

        for (int j = 0; j < 100; ++j) {
            Vector3f w =
                SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
            if (Inside(a, w) || Inside(b, w))
                EXPECT_TRUE(Inside(c, w))
                    << "a: " << a << ", b: " << b << ", union: " << c << ", w: " << w;
        }
    }
}